

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void rd_pick_rect_partition
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,
               PICK_MODE_CONTEXT *cur_partition_ctx,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,int idx,int mi_row,int mi_col,BLOCK_SIZE bsize,
               PARTITION_TYPE partition_type)

{
  int iVar1;
  RD_STATS best_rd;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  RD_STATS best_remain_rdcost;
  undefined8 local_58;
  long lStack_50;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  lVar5 = 0x7fffffffffffffff;
  if (((((best_rdc->rate == 0x7fffffff) ||
        (iVar1 = (part_search_state->sum_rdc).rate, iVar1 == 0x7fffffff)) ||
       (best_rdc->dist == 0x7fffffffffffffff)) ||
      ((lStack_50 = (part_search_state->sum_rdc).dist, lStack_50 == 0x7fffffffffffffff ||
       (best_rdc->rdcost == 0x7fffffffffffffff)))) ||
     ((part_search_state->sum_rdc).rdcost == 0x7fffffffffffffff)) {
    local_58 = 0x7fffffff;
    lStack_50 = 0x7fffffffffffffff;
    local_48 = 0x7fffffffffffffff;
    uStack_40 = 0x7fffffffffffffff;
    local_38 = 0;
  }
  else {
    lStack_50 = best_rdc->dist - lStack_50;
    uVar3 = best_rdc->rate - iVar1;
    local_58 = CONCAT44(local_58._4_4_,uVar3);
    if ((int)uVar3 < 0) {
      local_48 = lStack_50 * 0x80 - ((long)((ulong)-uVar3 * (long)x->rdmult + 0x100) >> 9);
    }
    else {
      local_48 = lStack_50 * 0x80 + ((long)((ulong)uVar3 * (long)x->rdmult + 0x100) >> 9);
    }
  }
  best_rd._33_7_ = uStack_37;
  best_rd.skip_txfm = local_38;
  best_rd.dist = lStack_50;
  best_rd.rate = (undefined4)local_58;
  best_rd.zero_rate = local_58._4_4_;
  best_rd.rdcost = local_48;
  best_rd.sse = uStack_40;
  pick_sb_modes(cpi,tile_data,x,mi_row,mi_col,&part_search_state->this_rdc,partition_type,bsize,
                cur_partition_ctx,best_rd);
  uVar3 = (part_search_state->this_rdc).rate;
  if ((((ulong)uVar3 == 0x7fffffff) ||
      (lVar2 = (part_search_state->this_rdc).dist, lVar2 == 0x7fffffffffffffff)) ||
     ((part_search_state->this_rdc).rdcost == 0x7fffffffffffffff)) {
    (part_search_state->this_rdc).rate = 0x7fffffff;
    (part_search_state->this_rdc).zero_rate = 0;
    (part_search_state->this_rdc).dist = 0x7fffffffffffffff;
    (part_search_state->this_rdc).rdcost = 0x7fffffffffffffff;
    (part_search_state->this_rdc).sse = 0x7fffffffffffffff;
    (part_search_state->this_rdc).skip_txfm = '\0';
    (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
  }
  else {
    lVar4 = (long)x->rdmult;
    if ((int)uVar3 < 0) {
      lVar5 = lVar2 * 0x80 - ((long)((ulong)-uVar3 * lVar4 + 0x100) >> 9);
    }
    else {
      lVar5 = lVar2 * 0x80 + ((long)((ulong)uVar3 * lVar4 + 0x100) >> 9);
    }
    (part_search_state->this_rdc).rdcost = lVar5;
    uVar3 = uVar3 + (part_search_state->sum_rdc).rate;
    (part_search_state->sum_rdc).rate = uVar3;
    lVar2 = lVar2 + (part_search_state->sum_rdc).dist;
    (part_search_state->sum_rdc).dist = lVar2;
    if ((lVar2 == 0x7fffffffffffffff || uVar3 == 0x7fffffff) ||
       ((part_search_state->sum_rdc).rdcost == 0x7fffffffffffffff)) {
      (part_search_state->sum_rdc).rate = 0x7fffffff;
      (part_search_state->sum_rdc).zero_rate = 0;
      (part_search_state->sum_rdc).dist = 0x7fffffffffffffff;
      (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
      (part_search_state->sum_rdc).sse = 0x7fffffffffffffff;
      (part_search_state->sum_rdc).skip_txfm = '\0';
    }
    else {
      if ((int)uVar3 < 0) {
        lVar2 = lVar2 * 0x80 - ((long)((ulong)-uVar3 * lVar4 + 0x100) >> 9);
      }
      else {
        lVar2 = lVar2 * 0x80 + ((long)((ulong)uVar3 * lVar4 + 0x100) >> 9);
      }
      (part_search_state->sum_rdc).rdcost = lVar2;
    }
  }
  part_search_state->rect_part_rd[partition_type != '\x01'][(uint)idx] = lVar5;
  return;
}

Assistant:

static void rd_pick_rect_partition(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                   MACROBLOCK *x,
                                   PICK_MODE_CONTEXT *cur_partition_ctx,
                                   PartitionSearchState *part_search_state,
                                   RD_STATS *best_rdc, const int idx,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   PARTITION_TYPE partition_type) {
  // Obtain the remainder from the best rd cost
  // for further processing of partition.
  RD_STATS best_remain_rdcost;
  av1_rd_stats_subtraction(x->rdmult, best_rdc, &part_search_state->sum_rdc,
                           &best_remain_rdcost);

  // Obtain the best mode for the partition sub-block.
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &part_search_state->this_rdc,
                partition_type, bsize, cur_partition_ctx, best_remain_rdcost);
  av1_rd_cost_update(x->rdmult, &part_search_state->this_rdc);

  // Update the partition rd cost with the current sub-block rd.
  if (part_search_state->this_rdc.rate == INT_MAX) {
    part_search_state->sum_rdc.rdcost = INT64_MAX;
  } else {
    part_search_state->sum_rdc.rate += part_search_state->this_rdc.rate;
    part_search_state->sum_rdc.dist += part_search_state->this_rdc.dist;
    av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  }
  const RECT_PART_TYPE rect_part =
      partition_type == PARTITION_HORZ ? HORZ : VERT;
  part_search_state->rect_part_rd[rect_part][idx] =
      part_search_state->this_rdc.rdcost;
}